

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextProfiler.h
# Opt level: O3

void __thiscall Js::ScriptContextProfiler::ProfilePrint(ScriptContextProfiler *this,Phase phase)

{
  if (this->profilerArena != (ArenaAllocator *)0x0) {
    Profiler::End(this->profiler,AllPhase);
    Profiler::Print(this->profiler,phase);
    if (this->backgroundRecyclerProfiler != (Profiler *)0x0) {
      Profiler::End(this->backgroundRecyclerProfiler,AllPhase);
      Profiler::Print(this->backgroundRecyclerProfiler,phase);
      Profiler::Begin(this->backgroundRecyclerProfiler,AllPhase);
    }
    Profiler::Begin(this->profiler,AllPhase);
    return;
  }
  return;
}

Assistant:

bool IsInitialized() const { return profilerArena != nullptr; }